

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

void __thiscall
PlanTestPoolWithFailingEdge::~PlanTestPoolWithFailingEdge(PlanTestPoolWithFailingEdge *this)

{
  pointer ppNVar1;
  pointer ppEVar2;
  
  (this->super_PlanTest).super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__PlanTest_001f7a58;
  std::_Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_EdgeCmp,_std::allocator<Edge_*>_>::~_Rb_tree
            (&(this->super_PlanTest).plan_.ready_._M_t);
  std::
  _Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
  ::~_Rb_tree((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
               *)&(this->super_PlanTest).plan_);
  (this->super_PlanTest).super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__StateTestWithBuiltinRules_001f45e8;
  ppNVar1 = (this->super_PlanTest).super_StateTestWithBuiltinRules.state_.defaults_.
            super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (ppNVar1 != (pointer)0x0) {
    operator_delete(ppNVar1,(long)*(pointer *)
                                   ((long)&(this->super_PlanTest).super_StateTestWithBuiltinRules.
                                           state_.defaults_.
                                           super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                           _M_impl.super__Vector_impl_data + 0x10) - (long)ppNVar1);
  }
  (this->super_PlanTest).super_StateTestWithBuiltinRules.state_.bindings_.super_Env._vptr_Env =
       (_func_int **)&PTR__BindingEnv_001fda60;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&(this->super_PlanTest).super_StateTestWithBuiltinRules.state_.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->super_PlanTest).super_StateTestWithBuiltinRules.state_.bindings_.bindings_.
               _M_t);
  ppEVar2 = (this->super_PlanTest).super_StateTestWithBuiltinRules.state_.edges_.
            super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)*(pointer *)
                                   ((long)&(this->super_PlanTest).super_StateTestWithBuiltinRules.
                                           state_.edges_.
                                           super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                                           _M_impl.super__Vector_impl_data + 0x10) - (long)ppEVar2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&(this->super_PlanTest).super_StateTestWithBuiltinRules.state_.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&(this->super_PlanTest).super_StateTestWithBuiltinRules.state_);
  operator_delete(this,0x188);
  return;
}

Assistant:

TEST_F(PlanTest, PoolWithFailingEdge) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
    "pool foobar\n"
    "  depth = 1\n"
    "rule poolcat\n"
    "  command = cat $in > $out\n"
    "  pool = foobar\n"
    "build out1: poolcat in\n"
    "build out2: poolcat in\n"));
  GetNode("out1")->MarkDirty();
  GetNode("out2")->MarkDirty();
  string err;
  EXPECT_TRUE(plan_.AddTarget(GetNode("out1"), &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(plan_.AddTarget(GetNode("out2"), &err));
  ASSERT_EQ("", err);
  ASSERT_TRUE(plan_.more_to_do());

  Edge* edge = plan_.FindWork();
  ASSERT_TRUE(edge);
  ASSERT_EQ("in",  edge->inputs_[0]->path());
  ASSERT_EQ("out1", edge->outputs_[0]->path());

  // This will be false since poolcat is serialized
  ASSERT_FALSE(plan_.FindWork());

  plan_.EdgeFinished(edge, Plan::kEdgeFailed, &err);
  ASSERT_EQ("", err);

  edge = plan_.FindWork();
  ASSERT_TRUE(edge);
  ASSERT_EQ("in", edge->inputs_[0]->path());
  ASSERT_EQ("out2", edge->outputs_[0]->path());

  ASSERT_FALSE(plan_.FindWork());

  plan_.EdgeFinished(edge, Plan::kEdgeFailed, &err);
  ASSERT_EQ("", err);

  ASSERT_TRUE(plan_.more_to_do()); // Jobs have failed
  edge = plan_.FindWork();
  ASSERT_EQ(0, edge);
}